

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

int check8(aint val)

{
  char local_58 [8];
  char buffer [64];
  int local_c;
  aint val_local;
  
  if ((val < -0x100) || (0xff < val)) {
    snprintf(local_58,0x40,"value 0x%X is truncated to 8bit value: 0x%02X",(ulong)(uint)val,
             (ulong)(val & 0xff));
    Warning(local_58,(char *)0x0,W_PASS3);
    local_c = 0;
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

int check8(aint val) {
	if (val < -256 || val > 255) {
		char buffer[64];
		SPRINTF2(buffer, 64, "value 0x%X is truncated to 8bit value: 0x%02X", val, val&0xFF);
		Warning(buffer);
		return 0;
	}
	return 1;
}